

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdot.cpp
# Opt level: O2

double dot(int n,block_q4_0 *x,float *y)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  float fVar5;
  
  iVar2 = 0;
  if (n < 1) {
    n = 0;
  }
  dVar4 = 0.0;
  for (; iVar2 != n; iVar2 = iVar2 + 1) {
    fVar5 = 0.0;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      uVar1 = *(uint *)(x->qs + lVar3);
      fVar5 = fVar5 + y[lVar3 * 2 + 7] * dot::kValues[uVar1 >> 0x1c] +
                      y[lVar3 * 2 + 6] *
                      *(float *)((long)dot::kValues + (ulong)(uVar1 >> 0x16 & 0x3c)) +
                      y[lVar3 * 2 + 5] *
                      *(float *)((long)dot::kValues + (ulong)(uVar1 >> 0x12 & 0x3c)) +
                      y[lVar3 * 2 + 4] *
                      *(float *)((long)dot::kValues + (ulong)(uVar1 >> 0xe & 0x3c)) +
                      y[lVar3 * 2 + 3] *
                      *(float *)((long)dot::kValues + (ulong)(uVar1 >> 10 & 0x3c)) +
                      y[lVar3 * 2 + 2] * *(float *)((long)dot::kValues + (ulong)(uVar1 >> 6 & 0x3c))
                      + y[lVar3 * 2] * dot::kValues[uVar1 & 0xf] +
                        y[lVar3 * 2 + 1] *
                        *(float *)((long)dot::kValues + (ulong)(uVar1 >> 2 & 0x3c));
    }
    y = y + 0x20;
    dVar4 = dVar4 + (double)(x->d * fVar5);
    x = x + 1;
  }
  return dVar4;
}

Assistant:

inline double dot(int n, const block_q4_0* x, const float* y) {
    const static float kValues[16] = {-8.f, -7.f, -6.f, -5.f, -4.f, -3.f, -2.f, -1.f, 0.f, 1.f, 2.f, 3.f, 4.f, 5.f, 6.f, 7.f};
    constexpr uint32_t kMask1 = 0x0f0f0f0f;
    uint32_t u1, u2;
    auto q1 = (const uint8_t*)&u1;
    auto q2 = (const uint8_t*)&u2;
    double sum = 0;
    for (int i=0; i<n; ++i) {
        float d = x->d;
        auto u = (const uint32_t*)x->qs;
        float s = 0;
        for (int k=0; k<4; ++k) {
            u1 = u[k] & kMask1;
            u2 = (u[k] >> 4) & kMask1;
            s += y[0]*kValues[q1[0]] + y[1]*kValues[q2[0]] +
                 y[2]*kValues[q1[1]] + y[3]*kValues[q2[1]] +
                 y[4]*kValues[q1[2]] + y[5]*kValues[q2[2]] +
                 y[6]*kValues[q1[3]] + y[7]*kValues[q2[3]];
            y += 8;
        }
        sum += s*d;
        ++x;
    }
    return sum;
}